

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void Qiniu_Region_Set_Rs_Preferred_Hosts
               (Qiniu_Region *region,char **hosts,size_t hostsCount,Qiniu_Bool useHttps)

{
  _Qiniu_Region_Service *p_Var1;
  _Qiniu_Region_Service *p_Var2;
  _Qiniu_Region_Service *oldRsService;
  Qiniu_Bool useHttps_local;
  size_t hostsCount_local;
  char **hosts_local;
  Qiniu_Region *region_local;
  
  if (region != (Qiniu_Region *)0x0) {
    if (region->rsService == (_Qiniu_Region_Service *)0x0) {
      p_Var2 = _Qiniu_Region_Service_New((char **)0x0,0,hosts,hostsCount,(char **)0x0,0,useHttps);
      region->rsService = p_Var2;
    }
    else {
      p_Var2 = region->rsService;
      p_Var1 = _Qiniu_Region_Service_New
                         (p_Var2->hosts,p_Var2->acceleratedHostsCount,hosts,hostsCount,
                          p_Var2->hosts +
                          p_Var2->acceleratedHostsCount + p_Var2->preferredHostsCount,
                          p_Var2->alternativeHostsCount,useHttps);
      region->rsService = p_Var1;
      _Qiniu_Region_Service_Free(p_Var2);
    }
  }
  return;
}

Assistant:

void Qiniu_Region_Set_Rs_Preferred_Hosts(Qiniu_Region *region, const char *const *hosts, size_t hostsCount, Qiniu_Bool useHttps)
{
    if (region == NULL)
    {
        return;
    }
    if (region->rsService != NULL)
    {
        struct _Qiniu_Region_Service *oldRsService = region->rsService;
        region->rsService = _Qiniu_Region_Service_New(
            oldRsService->hosts, oldRsService->acceleratedHostsCount,
            hosts, hostsCount,
            oldRsService->hosts + oldRsService->acceleratedHostsCount + oldRsService->preferredHostsCount, oldRsService->alternativeHostsCount,
            useHttps);
        _Qiniu_Region_Service_Free(oldRsService);
    }
    else
    {
        region->rsService = _Qiniu_Region_Service_New(NULL, 0, hosts, hostsCount, NULL, 0, useHttps);
    }
}